

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qline.cpp
# Opt level: O0

qreal __thiscall QLineF::angleTo(QLineF *this,QLineF *l)

{
  bool bVar1;
  double in_RSI;
  qreal p2;
  qreal qVar2;
  qreal delta_normalized;
  qreal delta;
  qreal a2;
  qreal a1;
  double local_48;
  QLineF *in_stack_fffffffffffffff8;
  
  bVar1 = isNull((QLineF *)0x625cd1);
  if ((bVar1) || (bVar1 = isNull((QLineF *)0x625cdf), bVar1)) {
    local_48 = 0.0;
  }
  else {
    p2 = angle(in_stack_fffffffffffffff8);
    qVar2 = angle(in_stack_fffffffffffffff8);
    local_48 = qVar2 - p2;
    if (local_48 < 0.0) {
      local_48 = local_48 + 360.0;
    }
    bVar1 = qFuzzyCompare(in_RSI,p2);
    if (bVar1) {
      local_48 = 0.0;
    }
  }
  return local_48;
}

Assistant:

qreal QLineF::angleTo(const QLineF &l) const
{
    if (isNull() || l.isNull())
        return 0;

    const qreal a1 = angle();
    const qreal a2 = l.angle();

    const qreal delta = a2 - a1;
    const qreal delta_normalized = delta < 0 ? delta + 360 : delta;

    if (qFuzzyCompare(delta, qreal(360)))
        return 0;
    else
        return delta_normalized;
}